

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseAssetIdentifier
          (AsciiParser *this,AssetPath *out,bool *triple_deliminated)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t uVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  StreamReader *pSVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  int iVar13;
  char *pcVar14;
  byte bVar15;
  string tok;
  vector<char,_std::allocator<char>_> buf;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  vector<char,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar6 = this->_sr->idx_;
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (!bVar5) {
    bVar5 = false;
    pcVar14 = (char *)0x0;
    goto LAB_00369059;
  }
  bVar5 = CharN(this,3,&local_1e8);
  if ((((bVar5) &&
       (*local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == '@')) &&
      (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start[1] == '@')) &&
     (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[2] == '@')) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = 0;
    pSVar8 = this->_sr;
    uVar6 = pSVar8->idx_;
    iVar13 = 0;
    if (uVar6 < pSVar8->length_) {
      bVar3 = 0;
      do {
        uVar2 = pSVar8->binary_[uVar6];
        if (uVar2 == '\0') break;
        pSVar8->idx_ = uVar6 + 1;
        if (uVar2 == '@') {
          iVar13 = iVar13 + 1;
        }
        else {
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          iVar13 = iVar13 + -1;
        }
        bVar15 = uVar2 == '\\' | bVar3;
        ::std::__cxx11::string::push_back((char)&local_228);
        if (iVar13 == 3) {
          if (!(bool)(uVar2 == '\\' | bVar3)) {
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"@@@","");
            removeSuffix(&local_208,(string *)&local_228,(string *)&local_1c8);
            local_1a8._0_8_ = local_1a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,local_208._M_dataplus._M_p,
                       local_208._M_dataplus._M_p + local_208._M_string_length);
            local_188._M_p = (pointer)local_178;
            local_180 = 0;
            local_178[0]._M_local_buf[0] = '\0';
            ::std::__cxx11::string::operator=((string *)out,(string *)local_1a8);
            ::std::__cxx11::string::operator=((string *)&out->resolved_path_,(string *)&local_188);
            tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            *triple_deliminated = true;
            iVar13 = 1;
            goto LAB_00368f7b;
          }
          bVar15 = 0;
          iVar13 = 0;
          if (3 < local_228._M_string_length) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"\\@@@","");
            if (local_228._M_string_length < (ulong)local_1a8._8_8_) {
              bVar5 = false;
            }
            else {
              lVar7 = ::std::__cxx11::string::find
                                ((char *)&local_228,local_1a8._0_8_,
                                 local_228._M_string_length - local_1a8._8_8_);
              bVar5 = lVar7 != -1;
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            bVar15 = 0;
            iVar13 = 0;
            if (bVar5) {
              if (local_228._M_string_length < 4) {
                ::std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
              }
              local_228._M_dataplus._M_p[local_228._M_string_length - 4] = '\0';
              local_228._M_string_length = local_228._M_string_length - 4;
              ::std::__cxx11::string::append((char *)&local_228);
              bVar15 = 0;
              iVar13 = 0;
            }
          }
        }
        pSVar8 = this->_sr;
        uVar6 = pSVar8->idx_;
        bVar3 = bVar15;
      } while (uVar6 < pSVar8->length_);
      iVar13 = 0;
    }
LAB_00368f7b:
    bVar5 = SUB41(iVar13,0);
    pcVar14 = local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_00369059;
LAB_00369047:
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT62(local_228.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_228.field_2._M_local_buf[1],
                                      local_228.field_2._M_local_buf[0])) + 1);
    pcVar14 = local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    pSVar8 = this->_sr;
    uVar4 = pSVar8->length_;
    if (uVar4 < uVar6) {
      uVar6 = pSVar8->idx_;
    }
    else {
      pSVar8->idx_ = uVar6;
    }
    uVar11 = uVar6 + 1;
    if (uVar11 <= uVar4) {
      bVar3 = pSVar8->binary_[uVar6];
      pSVar8->idx_ = uVar11;
      if ((bVar3 - 0x22 < 0x1f) && ((0x40000021U >> (bVar3 - 0x22 & 0x1f) & 1) != 0)) {
        paVar1 = &local_228.field_2;
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = 0;
        local_228._M_dataplus._M_p = (pointer)paVar1;
        if (uVar11 < uVar4) {
          do {
            bVar15 = pSVar8->binary_[uVar11];
            if (bVar15 == 0) break;
            pSVar8->idx_ = uVar11 + 1;
            if (bVar15 == bVar3) {
              local_1a8._0_8_ = local_1a8 + 0x10;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,local_228._M_dataplus._M_p,
                         local_228._M_dataplus._M_p + local_228._M_string_length);
              local_180 = 0;
              local_178[0]._M_local_buf[0] = '\0';
              local_188._M_p = (pointer)local_178;
              ::std::__cxx11::string::operator=((string *)out,(string *)local_1a8);
              ::std::__cxx11::string::operator=((string *)&out->resolved_path_,(string *)&local_188)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_p != local_178) {
                operator_delete(local_188._M_p,
                                CONCAT71(local_178[0]._M_allocated_capacity._1_7_,
                                         local_178[0]._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              *triple_deliminated = false;
              bVar5 = true;
              goto LAB_0036903e;
            }
            ::std::__cxx11::string::push_back((char)&local_228);
            pSVar8 = this->_sr;
            uVar11 = pSVar8->idx_;
          } while (uVar11 < pSVar8->length_);
        }
        bVar5 = false;
LAB_0036903e:
        pcVar14 = local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p == paVar1) goto LAB_00369059;
        goto LAB_00369047;
      }
      local_228._M_string_length = 1;
      local_228.field_2._M_local_buf[1] = '\0';
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228.field_2._M_local_buf[0] = bVar3;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ParseAssetIdentifier",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x96e);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      ::std::operator+(&local_1c8,"Asset must start with \'@\', \'\'\' or \'\"\', but got \'",
                       &local_228);
      plVar10 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208.field_2._8_8_ = plVar10[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_208._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT62(local_228.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_228.field_2._M_local_buf[1],
                                          local_228.field_2._M_local_buf[0])) + 1);
      }
    }
    bVar5 = false;
    pcVar14 = local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
LAB_00369059:
  if (pcVar14 != (char *)0x0) {
    operator_delete(pcVar14,(long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)pcVar14);
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ParseAssetIdentifier(value::AssetPath *out,
                                       bool *triple_deliminated) {
  // '..' or "..." are also allowed.
  // @...@
  // or @@@...@@@ (Triple '@'-deliminated asset identifier.)
  // @@@ = Path containing '@'. '@@@' in Path is encoded as '\@@@'
  //
  // Example:
  //   @bora@
  //   @@@bora@@@
  //   @@@bora\@@@dora@@@

  // TODO: Correctly support escape characters

  // look ahead.
  std::vector<char> buf;
  uint64_t curr = _sr->tell();
  bool maybe_triple{false};

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (CharN(3, &buf)) {
    if (buf[0] == '@' && buf[1] == '@' && buf[2] == '@') {
      maybe_triple = true;
    }
  }

  bool valid{false};

  if (!maybe_triple) {
    // delimiter = " ' @

    SeekTo(curr);
    char s;
    if (!Char1(&s)) {
      return false;
    }

    char delim = s;

    if ((s == '@') || (s == '\'') || (s == '"')) {
      // ok
    } else {
      std::string sstr{s};
      PUSH_ERROR_AND_RETURN(
          "Asset must start with '@', '\'' or '\"', but got '" + sstr + "'");
    }

    std::string tok;

    // Read until next delimiter
    bool found_delimiter = false;
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == delim) {
        found_delimiter = true;
        break;
      }

      tok += c;
    }

    if (found_delimiter) {
      (*out) = tok;
      (*triple_deliminated) = false;

      valid = true;
    }

  } else {
    bool found_delimiter{false};
    bool escape_sequence{false};
    int at_cnt{0};
    std::string tok;

    // Read until '@@@' appears
    // Need to escaped '@@@'("\\@@@")
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == '\\') {
        escape_sequence = true;
      }

      if (c == '@') {
        at_cnt++;
      } else {
        at_cnt--;
        if (at_cnt < 0) {
          at_cnt = 0;
        }
      }

      tok += c;

      if (at_cnt == 3) {
        if (escape_sequence) {
          // Still in path identifier...
          // Unescape "\\@@@"

          if (tok.size() > 3) {            // this should be true.
            if (endsWith(tok, "\\@@@")) {  // this also should be true.
              tok.erase(tok.size() - 4);
              tok.append("@@@");
            }
          }
          at_cnt = 0;
          escape_sequence = false;
        } else {
          // Got it. '@@@'
          found_delimiter = true;
          break;
        }
      }
    }

    if (found_delimiter) {
      // remote last '@@@'
      (*out) = removeSuffix(tok, "@@@");
      (*triple_deliminated) = true;

      valid = true;
    }
  }

  return valid;
}